

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Frame::IsValid(Frame *this)

{
  bool bVar1;
  Frame *in_RDI;
  bool local_1;
  
  if ((in_RDI->length_ == 0) || (in_RDI->frame_ == (uint8_t *)0x0)) {
    local_1 = false;
  }
  else if (((in_RDI->additional_length_ == 0) || (in_RDI->additional_ != (uint8_t *)0x0)) &&
          ((in_RDI->additional_ == (uint8_t *)0x0 || (in_RDI->additional_length_ != 0)))) {
    if ((in_RDI->track_number_ == 0) || (0x7e < in_RDI->track_number_)) {
      local_1 = false;
    }
    else {
      bVar1 = CanBeSimpleBlock(in_RDI);
      if (((bVar1) || ((in_RDI->is_key_ & 1U) != 0)) ||
         ((in_RDI->reference_block_timestamp_set_ & 1U) != 0)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Frame::IsValid() const {
  if (length_ == 0 || !frame_) {
    return false;
  }
  if ((additional_length_ != 0 && !additional_) ||
      (additional_ != NULL && additional_length_ == 0)) {
    return false;
  }
  if (track_number_ == 0 || track_number_ > kMaxTrackNumber) {
    return false;
  }
  if (!CanBeSimpleBlock() && !is_key_ && !reference_block_timestamp_set_) {
    return false;
  }
  return true;
}